

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_predict_intra_block
               (MACROBLOCKD *xd,BLOCK_SIZE sb_size,int enable_intra_edge_filter,int wpx,int hpx,
               TX_SIZE tx_size,PREDICTION_MODE mode,int angle_delta,int use_palette,
               FILTER_INTRA_MODE filter_intra_mode,uint8_t *ref,int ref_stride,uint8_t *dst,
               int dst_stride,int col_off,int row_off,int plane)

{
  ushort uVar1;
  int subsampling_y;
  MB_MODE_INFO *pMVar2;
  uint8_t *puVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint ss_y_00;
  int iVar10;
  int in_ECX;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  byte in_R9B;
  bool bVar11;
  bool bVar12;
  byte in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  char in_stack_00000020;
  undefined7 in_stack_00000021;
  int in_stack_0000002c;
  uint8_t *in_stack_00000030;
  long in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  int in_stack_00000050;
  int in_stack_00000058;
  int in_stack_00000074;
  PREDICTION_MODE in_stack_0000007b;
  int in_stack_0000007c;
  uint8_t *in_stack_00000080;
  int n_bottomleft_px;
  int n_topright_px;
  int intra_edge_filter_type;
  int disable_edge_filter;
  int have_bottom_left;
  int have_top_right;
  int need_bottom_left;
  int need_top_right;
  int p_angle;
  BLOCK_SIZE bsize;
  PARTITION_TYPE partition;
  int bottom_available;
  int right_available;
  int mi_col;
  int mi_row;
  int txh;
  int txw;
  int n_left_px;
  int n_top_px;
  int is_dr_mode;
  int use_filter_intra;
  int yd;
  int xr;
  int have_left;
  int have_top;
  int ss_y;
  int ss_x;
  macroblockd_plane *pd;
  uint16_t *dst16;
  uint16_t *palette;
  uint8_t *map;
  int c;
  int r;
  int is_hbd;
  int y;
  int x;
  int txhpx;
  int txwpx;
  MB_MODE_INFO *mbmi;
  TX_SIZE in_stack_0000016a;
  PREDICTION_MODE in_stack_0000016b;
  int in_stack_0000016c;
  uint8_t *in_stack_00000170;
  int in_stack_0000017c;
  uint8_t *in_stack_00000180;
  undefined3 in_stack_00000191;
  int in_stack_000001d4;
  int in_stack_000001dc;
  undefined4 in_stack_000001e4;
  int in_stack_000001ec;
  uint8_t *in_stack_000001f0;
  FILTER_INTRA_MODE in_stack_00000200;
  TX_SIZE in_stack_00000208;
  int in_stack_00000210;
  int in_stack_00000218;
  int in_stack_00000220;
  int in_stack_00000228;
  int in_stack_00000230;
  int in_stack_00000238;
  int in_stack_00000240;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  uint in_stack_fffffffffffffedc;
  uint mi_row_00;
  int local_114;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int local_74;
  int local_70;
  
  pMVar2 = *in_RDI->mi;
  local_114 = tx_size_wide[in_R9B];
  iVar9 = tx_size_high[in_R9B];
  iVar5 = is_cur_buf_hbd(in_RDI);
  if (in_stack_00000018 == 0) {
    iVar10 = in_RDI->plane[in_stack_00000058].subsampling_x;
    subsampling_y = in_RDI->plane[in_stack_00000058].subsampling_y;
    bVar11 = true;
    if (in_stack_00000050 == 0) {
      if (subsampling_y == 0) {
        bVar4 = in_RDI->up_available;
      }
      else {
        bVar4 = in_RDI->chroma_up_available;
      }
      in_stack_fffffffffffffef8 = (uint)(bVar4 & 1);
      bVar11 = in_stack_fffffffffffffef8 != 0;
    }
    bVar12 = true;
    if (in_stack_00000048 == 0) {
      if (iVar10 == 0) {
        bVar4 = in_RDI->left_available;
      }
      else {
        bVar4 = in_RDI->chroma_left_available;
      }
      in_stack_fffffffffffffef0 = (uint)(bVar4 & 1);
      bVar12 = in_stack_fffffffffffffef0 != 0;
    }
    iVar6 = ((in_RDI->mb_to_right_edge >> ((char)iVar10 + 3U & 0x1f)) + in_ECX +
            in_stack_00000048 * -4) - local_114;
    iVar7 = ((in_RDI->mb_to_bottom_edge >> ((byte)subsampling_y + 3 & 0x1f)) + in_R8D +
            in_stack_00000050 * -4) - iVar9;
    iVar8 = av1_is_directional_mode(in_stack_00000008);
    if (bVar11) {
      if (iVar6 + local_114 <= local_114) {
        local_114 = iVar6 + local_114;
      }
    }
    else {
      local_114._0_1_ = '\0';
    }
    if (bVar12) {
      if (iVar7 + iVar9 <= iVar9) {
        iVar9 = iVar7 + iVar9;
      }
    }
    else {
      iVar9 = 0;
    }
    if ((in_stack_00000020 != '\x05') || (iVar8 != 0)) {
      mi_row_00 = in_stack_fffffffffffffedc & 0xffffff;
      if (0 < iVar7) {
        mi_row_00 = CONCAT13((-in_RDI->mb_to_top_edge >> 5) +
                             (in_stack_00000050 + tx_size_high_unit[in_R9B] <<
                             ((byte)subsampling_y & 0x1f)) < (in_RDI->tile).mi_row_end,
                             (int3)in_stack_fffffffffffffedc);
      }
      if ((iVar10 != 0) || (subsampling_y != 0)) {
        scale_chroma_bsize(pMVar2->bsize,iVar10,subsampling_y);
      }
      bVar4 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_stack_00000008] & 8;
      ss_y_00 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_stack_00000008] & 0x20;
      if (in_stack_00000020 != '\x05') {
        bVar4 = 0;
        ss_y_00 = 0;
      }
      if (iVar8 != 0) {
        bVar4 = (int)((uint)""[in_stack_00000008] + in_stack_00000010) < 0x5a;
        ss_y_00 = (uint)(0xb4 < (int)((uint)""[in_stack_00000008] + in_stack_00000010));
      }
      if (bVar4 == 0) {
        iVar10 = -1;
      }
      else {
        in_stack_fffffffffffffe90 = in_stack_00000048;
        iVar10 = has_top_right((BLOCK_SIZE)((uint)in_stack_fffffffffffffed0 >> 0x18),
                               (BLOCK_SIZE)((uint)in_stack_fffffffffffffed0 >> 0x10),
                               in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
                               in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                               (PARTITION_TYPE)iVar9,(TX_SIZE)local_114,in_stack_fffffffffffffef0,
                               in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                               in_stack_ffffffffffffff08);
      }
      if (ss_y_00 != 0) {
        has_bottom_left((BLOCK_SIZE)((uint)iVar9 >> 0x18),(BLOCK_SIZE)((uint)iVar9 >> 0x10),
                        mi_row_00,iVar10,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                        (PARTITION_TYPE)in_stack_fffffffffffffef0,(TX_SIZE)in_stack_fffffffffffffef8
                        ,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff10,ss_y_00);
        in_stack_fffffffffffffe90 = in_stack_00000048;
      }
      get_intra_edge_filter_type
                ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe8c);
      if (iVar5 == 0) {
        build_directional_and_filter_intra_predictors
                  (_intra_edge_filter_type,n_topright_px,in_stack_00000080,in_stack_0000007c,
                   in_stack_0000007b,in_stack_00000074,(FILTER_INTRA_MODE)need_bottom_left,
                   (TX_SIZE)p_angle,bottom_available,mi_col,txh,n_left_px,is_dr_mode,yd);
      }
      else {
        highbd_build_directional_and_filter_intra_predictors
                  (in_stack_000001f0,in_stack_000001ec,(uint8_t *)CONCAT44(in_stack_000001e4,plane),
                   in_stack_000001dc,row_off._3_1_,in_stack_000001d4,in_stack_00000200,
                   in_stack_00000208,in_stack_00000210,in_stack_00000218,in_stack_00000220,
                   in_stack_00000228,in_stack_00000230,in_stack_00000238,in_stack_00000240);
      }
    }
    else if (iVar5 == 0) {
      build_non_directional_intra_predictors
                (in_stack_00000030,in_stack_0000002c,(uint8_t *)CONCAT71(in_stack_00000021,5),
                 in_stack_0000001c,'\0','\0',in_stack_00000040,in_stack_00000048);
    }
    else {
      highbd_build_non_directional_intra_predictors
                (in_stack_00000180,in_stack_0000017c,in_stack_00000170,in_stack_0000016c,
                 in_stack_0000016b,in_stack_0000016a,_mode,angle_delta,use_palette);
    }
  }
  else {
    puVar3 = in_RDI->plane[(int)(uint)(in_stack_00000058 != 0)].color_index_map;
    uVar1 = in_RDI->color_index_map_offset[(int)(uint)(in_stack_00000058 != 0)];
    if (iVar5 == 0) {
      for (local_70 = 0; local_70 < iVar9; local_70 = local_70 + 1) {
        for (local_74 = 0; local_74 < local_114; local_74 = local_74 + 1) {
          *(char *)(in_stack_00000038 + (local_70 * in_stack_00000040 + local_74)) =
               (char)(pMVar2->palette_mode_info).palette_colors
                     [(long)(in_stack_00000058 << 3) +
                      (ulong)puVar3[(long)((local_70 + in_stack_00000050 * 4) * in_ECX + local_74 +
                                          in_stack_00000048 * 4) + (long)(int)(uint)uVar1]];
        }
      }
    }
    else {
      for (local_70 = 0; local_70 < iVar9; local_70 = local_70 + 1) {
        for (local_74 = 0; local_74 < local_114; local_74 = local_74 + 1) {
          *(uint16_t *)(in_stack_00000038 * 2 + (long)(local_70 * in_stack_00000040 + local_74) * 2)
               = (pMVar2->palette_mode_info).palette_colors
                 [(long)(in_stack_00000058 << 3) +
                  (ulong)puVar3[(long)((local_70 + in_stack_00000050 * 4) * in_ECX + local_74 +
                                      in_stack_00000048 * 4) + (long)(int)(uint)uVar1]];
        }
      }
    }
  }
  return;
}

Assistant:

void av1_predict_intra_block(const MACROBLOCKD *xd, BLOCK_SIZE sb_size,
                             int enable_intra_edge_filter, int wpx, int hpx,
                             TX_SIZE tx_size, PREDICTION_MODE mode,
                             int angle_delta, int use_palette,
                             FILTER_INTRA_MODE filter_intra_mode,
                             const uint8_t *ref, int ref_stride, uint8_t *dst,
                             int dst_stride, int col_off, int row_off,
                             int plane) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  const int x = col_off << MI_SIZE_LOG2;
  const int y = row_off << MI_SIZE_LOG2;
  const int is_hbd = is_cur_buf_hbd(xd);

  assert(mode < INTRA_MODES);

  if (use_palette) {
    int r, c;
    const uint8_t *const map = xd->plane[plane != 0].color_index_map +
                               xd->color_index_map_offset[plane != 0];
    const uint16_t *const palette =
        mbmi->palette_mode_info.palette_colors + plane * PALETTE_MAX_SIZE;
    if (is_hbd) {
      uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst16[r * dst_stride + c] = palette[map[(r + y) * wpx + c + x]];
        }
      }
    } else {
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst[r * dst_stride + c] =
              (uint8_t)palette[map[(r + y) * wpx + c + x]];
        }
      }
    }
    return;
  }

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  const int have_top =
      row_off || (ss_y ? xd->chroma_up_available : xd->up_available);
  const int have_left =
      col_off || (ss_x ? xd->chroma_left_available : xd->left_available);

  // Distance between the right edge of this prediction block to
  // the frame right edge
  const int xr = (xd->mb_to_right_edge >> (3 + ss_x)) + wpx - x - txwpx;
  // Distance between the bottom edge of this prediction block to
  // the frame bottom edge
  const int yd = (xd->mb_to_bottom_edge >> (3 + ss_y)) + hpx - y - txhpx;
  const int use_filter_intra = filter_intra_mode != FILTER_INTRA_MODES;
  const int is_dr_mode = av1_is_directional_mode(mode);

  // The computations in this function, as well as in build_intra_predictors(),
  // are generalized for all intra modes. Some of these operations are not
  // required since non-directional intra modes (i.e., DC, SMOOTH, SMOOTH_H,
  // SMOOTH_V, and PAETH) specifically require left and top neighbors. Hence, a
  // separate function build_non_directional_intra_predictors() is introduced
  // for these modes to avoid redundant computations while generating pred data.

  const int n_top_px = have_top ? AOMMIN(txwpx, xr + txwpx) : 0;
  const int n_left_px = have_left ? AOMMIN(txhpx, yd + txhpx) : 0;
  if (!use_filter_intra && !is_dr_mode) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_hbd) {
      highbd_build_non_directional_intra_predictors(
          ref, ref_stride, dst, dst_stride, mode, tx_size, n_top_px, n_left_px,
          xd->bd);
      return;
    }
#endif  // CONFIG_AV1_HIGHBITDEPTH
    build_non_directional_intra_predictors(ref, ref_stride, dst, dst_stride,
                                           mode, tx_size, n_top_px, n_left_px);
    return;
  }

  const int txw = tx_size_wide_unit[tx_size];
  const int txh = tx_size_high_unit[tx_size];
  const int mi_row = -xd->mb_to_top_edge >> (3 + MI_SIZE_LOG2);
  const int mi_col = -xd->mb_to_left_edge >> (3 + MI_SIZE_LOG2);
  const int right_available =
      mi_col + ((col_off + txw) << ss_x) < xd->tile.mi_col_end;
  const int bottom_available =
      (yd > 0) && (mi_row + ((row_off + txh) << ss_y) < xd->tile.mi_row_end);

  const PARTITION_TYPE partition = mbmi->partition;

  BLOCK_SIZE bsize = mbmi->bsize;
  // force 4x4 chroma component block size.
  if (ss_x || ss_y) {
    bsize = scale_chroma_bsize(bsize, ss_x, ss_y);
  }

  int p_angle = 0;
  int need_top_right = extend_modes[mode] & NEED_ABOVERIGHT;
  int need_bottom_left = extend_modes[mode] & NEED_BOTTOMLEFT;

  if (use_filter_intra) {
    need_top_right = 0;
    need_bottom_left = 0;
  }
  if (is_dr_mode) {
    p_angle = mode_to_angle_map[mode] + angle_delta;
    need_top_right = p_angle < 90;
    need_bottom_left = p_angle > 180;
  }

  // Possible states for have_top_right(TR) and have_bottom_left(BL)
  // -1 : TR and BL are not needed
  //  0 : TR and BL are needed but not available
  // > 0 : TR and BL are needed and pixels are available
  const int have_top_right =
      need_top_right ? has_top_right(sb_size, bsize, mi_row, mi_col, have_top,
                                     right_available, partition, tx_size,
                                     row_off, col_off, ss_x, ss_y)
                     : -1;
  const int have_bottom_left =
      need_bottom_left ? has_bottom_left(sb_size, bsize, mi_row, mi_col,
                                         bottom_available, have_left, partition,
                                         tx_size, row_off, col_off, ss_x, ss_y)
                       : -1;

  const int disable_edge_filter = !enable_intra_edge_filter;
  const int intra_edge_filter_type = get_intra_edge_filter_type(xd, plane);
  const int n_topright_px =
      have_top_right > 0 ? AOMMIN(txwpx, xr) : have_top_right;
  const int n_bottomleft_px =
      have_bottom_left > 0 ? AOMMIN(txhpx, yd) : have_bottom_left;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_hbd) {
    highbd_build_directional_and_filter_intra_predictors(
        ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
        tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
        n_bottomleft_px, intra_edge_filter_type, xd->bd);
    return;
  }
#endif
  build_directional_and_filter_intra_predictors(
      ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
      tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
      n_bottomleft_px, intra_edge_filter_type);
}